

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen12::ValidateCCS(PlatformInfoGen12 *this,GMM_TEXTURE_INFO *Surf)

{
  SKU_FEATURE_TABLE *pSVar1;
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen12 *this_local;
  
  if (((((((ulong)(Surf->Flags).Gpu >> 0x15 & 1) == 0) &&
        (((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0)) &&
       (((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0)) &&
      ((pSVar1 = Context::GetSkuTable
                           ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                            super_PlatformInfo.pGmmLibContext),
       ((ulong)pSVar1->field_1 >> 0x22 & 1) == 0 || (((ulong)(Surf->Flags).Info >> 0x2d & 1) != 0)))
      ) || (((((int)Surf->Type < 2 || (4 < (int)Surf->Type)) ||
             ((((((ulong)(Surf->Flags).Info >> 0x24 & 1) == 0 &&
                (((ulong)(Surf->Flags).Info >> 0x2b & 1) == 0)) &&
               (((ulong)(Surf->Flags).Info >> 0x26 & 1) == 0)) &&
              (((ulong)(Surf->Flags).Info >> 0x2c & 1) == 0)))) &&
            (((((ulong)(Surf->Flags).Info >> 0x13 & 1) == 0 || (Surf->Type != RESOURCE_BUFFER)) &&
             ((pSVar1 = Context::GetSkuTable
                                  ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                                   super_PlatformInfo.pGmmLibContext),
              ((ulong)pSVar1->field_1 >> 0x19 & 1) == 0 ||
              (((ulong)(Surf->Flags).Info >> 0x23 & 1) != 0)))))))) {
    this_local._7_1_ = '\0';
  }
  else {
    pSVar1 = Context::GetSkuTable
                       ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
                        pGmmLibContext);
    if ((((((ulong)pSVar1->field_1 >> 0x19 & 1) == 0) &&
         (((ulong)(Surf->Flags).Info >> 0x13 & 1) != 0)) && (Surf->Type == RESOURCE_BUFFER)) &&
       (((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0)) {
      this_local._7_1_ = '\0';
    }
    else if (((((ulong)(Surf->Flags).Gpu >> 0x29 & 1) == 0) &&
             (((ulong)(Surf->Flags).Gpu >> 0x2b & 1) == 0)) &&
            (((((ulong)(Surf->Flags).Gpu >> 0x15 & 1) == 0 &&
              ((((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0 &&
               (((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0)))) &&
             (((ulong)(Surf->Flags).Info >> 0x2d & 1) != 0)))) {
      this_local._7_1_ = '\0';
    }
    else if ((((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0) ||
            (((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0)) {
      pSVar1 = Context::GetSkuTable
                         ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo
                          .pGmmLibContext);
      if ((((ulong)pSVar1->field_1 >> 0x12 & 1) == 0) &&
         ((((Surf->Type == RESOURCE_3D || (Surf->MaxLod != 0)) || (1 < (Surf->MSAA).NumSamples)) ||
          (((((ulong)(Surf->Flags).Info >> 0x25 & 1) == 0 &&
            (((ulong)(Surf->Flags).Info >> 0x26 & 1) == 0)) &&
           (((ulong)(Surf->Flags).Info >> 0x2c & 1) == 0)))))) {
        this_local._7_1_ = '\0';
      }
      else {
        *(ushort *)&(Surf->Flags).Wa = *(ushort *)&(Surf->Flags).Wa & 0xfbff;
        this_local._7_1_ = '\x01';
      }
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::ValidateCCS(GMM_TEXTURE_INFO &Surf)
{

    if (!(                                    //--- Legitimate CCS Case ----------------------------------------
        ((Surf.Flags.Gpu.ProceduralTexture || //procedural texture, or compressed surface (no more separate Aux-CCS)
          Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed) ||
         pGmmLibContext->GetSkuTable().FtrXe2Compression && !Surf.Flags.Info.NotCompressed) &&
        (((Surf.Type >= RESOURCE_2D && Surf.Type <= RESOURCE_CUBE) &&       //Not supported: 1D (until Flat CCS); Others Supported: Buffer, 2D, 3D, cube, Arrays, mip-maps, MSAA, Depth/Stencil
          (GMM_IS_4KB_TILE(Surf.Flags) || GMM_IS_64KB_TILE(Surf.Flags))) || //Only on 2D + Y/Ys or Lienar buffer (until Flat CCS)
         (Surf.Flags.Info.Linear && Surf.Type == RESOURCE_BUFFER) ||
         ((pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) && !Surf.Flags.Info.TiledX))))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage!");
        return 0;
    }

    if (!pGmmLibContext->GetSkuTable().FtrFlatPhysCCS &&
        Surf.Flags.Info.Linear && Surf.Type == RESOURCE_BUFFER && !Surf.Flags.Info.RenderCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - MLC only supported as RC!");
        return 0;
    }

    //Compressed resource (main surf) must pre-define MC/RC type
    if(!(Surf.Flags.Gpu.__NonMsaaTileYCcs || Surf.Flags.Gpu.__NonMsaaLinearCCS) &&
       !Surf.Flags.Gpu.ProceduralTexture &&
        !(Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed || !Surf.Flags.Info.NotCompressed))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - RC/MC type unspecified!");
        return 0;
    }

    if(Surf.Flags.Info.RenderCompressed && Surf.Flags.Info.MediaCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - can't be both RC and MC!");
        return 0;
    }

    if(!pGmmLibContext->GetSkuTable().FtrLinearCCS &&
       (Surf.Type == RESOURCE_3D || Surf.MaxLod > 0 || Surf.MSAA.NumSamples > 1 ||
        !(Surf.Flags.Info.TiledYf || GMM_IS_64KB_TILE(Surf.Flags))))
    {
        GMM_ASSERTDPF(0, "CCS support for (volumetric, mip'd, MSAA'd, TileY) resources only enabled with Linear CCS!");
        return 0;
    }

    GMM_ASSERTDPF((Surf.Flags.Wa.PreGen12FastClearOnly == 0), "FastClear Only unsupported on Gen12+!");
    Surf.Flags.Wa.PreGen12FastClearOnly = 0;

    return 1;
}